

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

int __thiscall CVmMemorySourceList::seek(CVmMemorySourceList *this,long pos,int mode)

{
  int in_EDX;
  long in_RSI;
  CVmMemorySourceList *in_RDI;
  CVmMemorySourceBlock *b;
  CVmMemorySourceBlock *local_28;
  long local_18;
  
  local_18 = in_RSI;
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      local_18 = get_pos(in_RDI);
      local_18 = local_18 + in_RSI;
    }
    else {
      if (in_EDX != 2) {
        return 1;
      }
      local_18 = get_size(in_RDI);
      local_18 = local_18 + in_RSI;
    }
  }
  if (local_18 < 0) {
    local_18 = 0;
  }
  else if (in_RDI->len_ <= local_18) {
    in_RDI->cur_block_ = in_RDI->last_block_;
    in_RDI->cur_block_ofs_ = in_RDI->len_ - in_RDI->last_block_->ofs;
    return 0;
  }
  local_28 = in_RDI->first_block_;
  while( true ) {
    if (local_28 == (CVmMemorySourceBlock *)0x0) {
      return 0;
    }
    if ((local_28->ofs <= local_18) && (local_18 < local_28->ofs + 0x1000)) break;
    local_28 = local_28->nxt;
  }
  in_RDI->cur_block_ = local_28;
  in_RDI->cur_block_ofs_ = local_18 - local_28->ofs;
  return 0;
}

Assistant:

int seek(long pos, int mode)
    {
        /* figure the absolute position based on the mode */
        switch (mode)
        {
        case OSFSK_SET:
            /* from the beginning - use pos as given */
            break;

        case OSFSK_CUR:
            /* from the current position */
            pos += get_pos();
            break;

        case OSFSK_END:
            /* from the end */
            pos += get_size();
            break;

        default:
            /* other modes are invalid */
            return 1;
        }

        /* limit the position to the file's bounds */
        if (pos < 0)
        {
            /* at start of file */
            pos = 0;
        }
        else if (pos >= len_)
        {
            /* 
             *   At end of file.  This is a special case for setting the
             *   block pointer, because we could be positioned at the last
             *   byte of the last block, which we won't find in our scan.
             *   Explicitly set the position here.  
             */
            pos = len_;
            cur_block_ = last_block_;
            cur_block_ofs_ = pos - last_block_->ofs;

            /* we've set the block position, so skip the usual search */
            return 0;
        }

        /* find the block containing the seek offset */
        CVmMemorySourceBlock *b;
        for (b = first_block_ ; b != 0 ; b = b->nxt)
        {
            /* if the offset is within this block, we're done */
            if (pos >= b->ofs && pos < b->ofs + BlockLen)
            {
                /* set the current pointers */
                cur_block_ = b;
                cur_block_ofs_ = pos - b->ofs;

                /* stop scanning */
                break;
            }
        }

        /* success */
        return 0;
    }